

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O1

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::getPtr<wasm::SIMDLoad>
          (Replacer *this,SIMDLoad *curr,Index bytes)

{
  uintptr_t uVar1;
  undefined1 auVar2 [16];
  Index index;
  Block *value;
  Expression *pEVar3;
  Type in_R8;
  LocalSet *local_68;
  Expression *local_60;
  undefined4 *local_58;
  initializer_list<wasm::Expression_*> local_50;
  Builder *local_40;
  LocalSet *local_38;
  
  value = (Block *)addOffsetGlobal(this,curr->ptr,(Name)(curr->memory).super_IString.str);
  if (this->parent->checkBounds == true) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (this->parent->pointerType).id;
    index = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar2 << 0x40),in_R8);
    local_40 = &this->builder;
    local_38 = Builder::makeLocalSet(local_40,index,(Expression *)value);
    pEVar3 = makePtrBoundsCheck<wasm::SIMDLoad>(this,curr,index,bytes);
    uVar1 = (this->parent->pointerType).id;
    local_58 = (undefined4 *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
    *local_58 = 8;
    local_58[4] = index;
    *(uintptr_t *)(local_58 + 2) = uVar1;
    local_50._M_array = (iterator)&local_68;
    local_68 = local_38;
    local_50._M_len = 3;
    local_60 = pEVar3;
    value = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>(local_40,&local_50);
  }
  return (Expression *)value;
}

Assistant:

Expression* getPtr(T* curr, Index bytes) {
      Expression* ptrValue = addOffsetGlobal(curr->ptr, curr->memory);
      if (parent.checkBounds) {
        Index ptrIdx = Builder::addVar(getFunction(), parent.pointerType);
        Expression* ptrSet = builder.makeLocalSet(ptrIdx, ptrValue);
        Expression* boundsCheck = makePtrBoundsCheck(curr, ptrIdx, bytes);
        Expression* ptrGet = builder.makeLocalGet(ptrIdx, parent.pointerType);
        return builder.makeBlock({ptrSet, boundsCheck, ptrGet});
      }

      return ptrValue;
    }